

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  float value;
  double value_00;
  LogMessage *other;
  long lVar1;
  char *__s;
  SubstituteArg *this_00;
  SubstituteArg local_1f0;
  undefined1 local_1c0 [32];
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_
              (__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0x70),(uint)field);
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_((string *)&local_1f0,*(protobuf **)(this + 0x70),(long)field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"GOOGLE_LONGLONG(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,")");
    goto LAB_001b0b2d;
  case 3:
    SimpleItoa_abi_cxx11_
              ((string *)&stack0xfffffffffffffdd8,(protobuf *)(ulong)*(uint *)(this + 0x70),
               (uint)field);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"u");
    break;
  case 4:
    SimpleItoa_abi_cxx11_((string *)&local_1f0,*(protobuf **)(this + 0x70),(unsigned_long)field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"GOOGLE_ULONGLONG(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,")");
LAB_001b0b2d:
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    this_00 = &local_1f0;
    break;
  case 5:
    value_00 = *(double *)(this + 0x70);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,value_00);
          return __return_storage_ptr__;
        }
        __s = "::google::protobuf::internal::NaN()";
      }
      else {
        __s = "-::google::protobuf::internal::Infinity()";
      }
    }
    else {
      __s = "::google::protobuf::internal::Infinity()";
    }
    goto LAB_001b0a7f;
  case 6:
    value = *(float *)(this + 0x70);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,value);
          lVar1 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x230744);
          if (lVar1 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        __s = "static_cast<float>(::google::protobuf::internal::NaN())";
      }
      else {
        __s = "static_cast<float>(-::google::protobuf::internal::Infinity())";
      }
    }
    else {
      __s = "static_cast<float>(::google::protobuf::internal::Infinity())";
    }
    goto LAB_001b0a7f;
  case 7:
    __s = "false";
    if (this[0x70] != (cpp)0x0) {
      __s = "true";
    }
    goto LAB_001b0a7f;
  case 8:
    ClassName_abi_cxx11_((string *)local_1c0,*(cpp **)(this + 0x50),(EnumDescriptor *)0x1,true);
    strings::internal::SubstituteArg::SubstituteArg
              (&local_1f0,*(int *)(*(long *)(this + 0x70) + 0x10));
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    local_50.text_ = (char *)0x0;
    local_50.size_ = -1;
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_170.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",&stack0xfffffffffffffdd8,
               &local_1f0,&local_1a0,&local_50,&local_80,&local_b0,&local_e0,&local_110,&local_140,
               &local_170,(SubstituteArg *)local_1c0._0_8_);
    this_00 = (SubstituteArg *)local_1c0;
    break;
  case 9:
    CEscape((string *)&local_1a0,*(string **)(this + 0x70));
    EscapeTrigraphs((string *)&local_1f0,(string *)&local_1a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"\"");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    std::__cxx11::string::~string((string *)&local_1f0);
    this_00 = &local_1a0;
    break;
  case 10:
    FieldMessageTypeName_abi_cxx11_((string *)&stack0xfffffffffffffdd8,this,field);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"::default_instance()");
    this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdd8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x14d);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdd8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_1f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdd8);
    __s = "";
LAB_001b0a7f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&stack0xfffffffffffffdd8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc rejects the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == kint32min) {
        // Make sure we are in a 2's complement system.
        GOOGLE_COMPILE_ASSERT(kint32min == -0x80000000, kint32min_value_error);
        return "-0x80000000";
      }
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      // See the comments for CPPTYPE_INT32.
      if (field->default_value_int64() == kint64min) {
        // Make sure we are in a 2's complement system.
        GOOGLE_COMPILE_ASSERT(kint64min == GOOGLE_LONGLONG(-0x8000000000000000),
                       kint64min_value_error);
        return "GOOGLE_LONGLONG(-0x8000000000000000)";
      }
      return "GOOGLE_LONGLONG(" + SimpleItoa(field->default_value_int64()) + ")";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "GOOGLE_ULONGLONG(" + SimpleItoa(field->default_value_uint64())+ ")";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "::google::protobuf::internal::Infinity()";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "-::google::protobuf::internal::Infinity()";
      } else if (value != value) {
        return "::google::protobuf::internal::NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT:
      {
        float value = field->default_value_float();
        if (value == numeric_limits<float>::infinity()) {
          return "static_cast<float>(::google::protobuf::internal::Infinity())";
        } else if (value == -numeric_limits<float>::infinity()) {
          return "static_cast<float>(-::google::protobuf::internal::Infinity())";
        } else if (value != value) {
          return "static_cast<float>(::google::protobuf::internal::NaN())";
        } else {
          string float_value = SimpleFtoa(value);
          // If floating point value contains a period (.) or an exponent
          // (either E or e), then append suffix 'f' to make it a float
          // literal.
          if (float_value.find_first_of(".eE") != string::npos) {
            float_value.push_back('f');
          }
          return float_value;
        }
      }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)",
          ClassName(field->enum_type(), true),
          field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" + EscapeTrigraphs(
        CEscape(field->default_value_string())) +
        "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return FieldMessageTypeName(field) + "::default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}